

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ImGuiIO *pIVar4;
  string_view format_str;
  string_view format_str_00;
  undefined8 local_18 [2];
  
  glfwSetErrorCallback(glfw_error_callback);
  iVar3 = glfwInit();
  if (iVar3 == 0) {
    local_18[0] = 0;
    format_str.size_ = 0x1a;
    format_str.data_ = "Failed to initialize GLFW\n";
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_18;
    fmt::v6::vprint(format_str,(format_args)(auVar1 << 0x40));
    iVar3 = 1;
  }
  else {
    glfwWindowHint(0x2100d,4);
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x22008,0x32001);
    iVar3 = 0;
    g_window = glfwCreateWindow(0x500,0x2d0,"WebGui Demo",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    glfwMakeContextCurrent(g_window);
    glfwSwapInterval(1);
    if (g_window == (GLFWwindow *)0x0) {
      local_18[0] = 0;
      format_str_00.size_ = 0x1c;
      format_str_00.data_ = "Failed to open GLFW window.\n";
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_18;
      fmt::v6::vprint(format_str_00,(format_args)(auVar2 << 0x40));
      glfwTerminate();
      iVar3 = -1;
    }
    else {
      gladLoadGL(glfwGetProcAddress);
      ImGui::DebugCheckVersionAndDataLayout("1.77 WIP",0x1560,0x3b8,8,0x10,0x14,2);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      pIVar4 = ImGui::GetIO();
      pIVar4->IniFilename = "imgui_state.ini";
      ImGui_ImplGlfw_InitForOpenGL(g_window,false);
      ImGui_ImplOpenGL3_Init((char *)0x0);
      apply_charcoal_style((ImGuiStyle *)0x0);
      font_14 = fonts::font_combined(14.0);
      font_16 = fonts::font_combined(16.0);
      font_18 = fonts::font_combined(18.0);
      glfwSetMouseButtonCallback(g_window,ImGui_ImplGlfw_MouseButtonCallback);
      glfwSetScrollCallback(g_window,ImGui_ImplGlfw_ScrollCallback);
      glfwSetKeyCallback(g_window,ImGui_ImplGlfw_KeyCallback);
      glfwSetCharCallback(g_window,ImGui_ImplGlfw_CharCallback);
    }
  }
  return iVar3;
}

Assistant:

int init()
{
    glfwSetErrorCallback( glfw_error_callback );

    if( !glfwInit() )
    {
        fmt::print( "Failed to initialize GLFW\n" );
        return 1;
    }

    glfwWindowHint( GLFW_SAMPLES, 4 ); // 4x antialiasing
    glfwWindowHint( GLFW_CONTEXT_VERSION_MAJOR, 3 );
    glfwWindowHint( GLFW_CONTEXT_VERSION_MINOR, 2 );
    glfwWindowHint( GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE ); // We don't want the old OpenGL
    // glfwWindowHint( GLFW_DECORATED, false );
    // glfwWindowHint( GLFW_RESIZABLE, true );
#if __APPLE__
    glfwWindowHint( GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE );
#endif

    // Open a window and create its OpenGL context
    int canvasWidth  = 1280;
    int canvasHeight = 720;
    g_window         = glfwCreateWindow( canvasWidth, canvasHeight, "WebGui Demo", NULL, NULL );
    glfwMakeContextCurrent( g_window );
    glfwSwapInterval( 1 ); // Enable vsync

    if( g_window == NULL )
    {
        fmt::print( "Failed to open GLFW window.\n" );
        glfwTerminate();
        return -1;
    }

    gladLoadGL( (GLADloadfunc)glfwGetProcAddress ); // Initialize GLAD

    // Setup Dear ImGui binding
    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGuiIO & io   = ImGui::GetIO();
    io.IniFilename = "imgui_state.ini";

    ImGui_ImplGlfw_InitForOpenGL( g_window, false );
    ImGui_ImplOpenGL3_Init();

    // Setup style
    // ImGui::StyleColorsDark();
    // ImGui::StyleColorsClassic();
    apply_charcoal_style();

    // Load Fonts
    font_14 = fonts::font_combined( 14 );
    font_16 = fonts::font_combined( 16 );
    font_18 = fonts::font_combined( 18 );

    // Cursor callbacks
    glfwSetMouseButtonCallback( g_window, ImGui_ImplGlfw_MouseButtonCallback );
    glfwSetScrollCallback( g_window, ImGui_ImplGlfw_ScrollCallback );
    glfwSetKeyCallback( g_window, ImGui_ImplGlfw_KeyCallback );
    glfwSetCharCallback( g_window, ImGui_ImplGlfw_CharCallback );

#ifdef __EMSCRIPTEN__
    resizeCanvas();
#endif

    return 0;
}